

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writesrc.cpp
# Opt level: O2

void usrc_writeUCPTrieArrays
               (FILE *f,char *indexPrefix,char *dataPrefix,UCPTrie *pTrie,char *postfix)

{
  char cVar1;
  int32_t width;
  
  width = 0x10;
  usrc_writeArray(f,indexPrefix,pTrie->index,0x10,pTrie->indexLength,postfix);
  cVar1 = pTrie->valueWidth;
  if (cVar1 != '\0') {
    if (cVar1 == '\x01') {
      width = 0x20;
    }
    else {
      width = (uint)(cVar1 == '\x02') << 3;
    }
  }
  usrc_writeArray(f,dataPrefix,(pTrie->data).ptr0,width,pTrie->dataLength,postfix);
  return;
}

Assistant:

U_CAPI void U_EXPORT2
usrc_writeUCPTrieArrays(FILE *f,
                        const char *indexPrefix, const char *dataPrefix,
                        const UCPTrie *pTrie,
                        const char *postfix) {
    usrc_writeArray(f, indexPrefix, pTrie->index, 16, pTrie->indexLength, postfix);
    int32_t width=
        pTrie->valueWidth==UCPTRIE_VALUE_BITS_16 ? 16 :
        pTrie->valueWidth==UCPTRIE_VALUE_BITS_32 ? 32 :
        pTrie->valueWidth==UCPTRIE_VALUE_BITS_8 ? 8 : 0;
    usrc_writeArray(f, dataPrefix, pTrie->data.ptr0, width, pTrie->dataLength, postfix);
}